

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::SetupOtherInputs(VersionSet *this,Compaction *c)

{
  Logger *info_log;
  bool bVar1;
  uint level_00;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  size_type sVar5;
  size_type sVar6;
  int64_t iVar7;
  size_type sVar8;
  size_type sVar9;
  Slice local_168 [2];
  undefined1 local_148 [8];
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> expanded1;
  InternalKey new_limit;
  InternalKey new_start;
  int64_t expanded0_size;
  int64_t inputs1_size;
  int64_t inputs0_size;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> expanded0;
  InternalKey all_limit;
  InternalKey all_start;
  undefined1 local_70 [8];
  InternalKey largest;
  InternalKey smallest;
  int level;
  Compaction *c_local;
  VersionSet *this_local;
  
  level_00 = Compaction::level(c);
  InternalKey::InternalKey((InternalKey *)&largest.field_0x18);
  InternalKey::InternalKey((InternalKey *)local_70);
  AddBoundaryInputs(&this->icmp_,this->current_->files_ + (int)level_00,c->inputs_);
  GetRange(this,c->inputs_,(InternalKey *)&largest.field_0x18,(InternalKey *)local_70);
  Version::GetOverlappingInputs
            (this->current_,level_00 + 1,(InternalKey *)&largest.field_0x18,(InternalKey *)local_70,
             c->inputs_ + 1);
  InternalKey::InternalKey((InternalKey *)&all_limit.field_0x18);
  InternalKey::InternalKey
            ((InternalKey *)
             &expanded0.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  GetRange2(this,c->inputs_,c->inputs_ + 1,(InternalKey *)&all_limit.field_0x18,
            (InternalKey *)
            &expanded0.
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    (c->inputs_ + 1);
  if (!bVar1) {
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               &inputs0_size);
    Version::GetOverlappingInputs
              (this->current_,level_00,(InternalKey *)&all_limit.field_0x18,
               (InternalKey *)
               &expanded0.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               &inputs0_size);
    AddBoundaryInputs(&this->icmp_,this->current_->files_ + (int)level_00,
                      (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                      &inputs0_size);
    iVar2 = TotalFileSize(c->inputs_);
    iVar3 = TotalFileSize(c->inputs_ + 1);
    iVar4 = TotalFileSize((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           *)&inputs0_size);
    sVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       &inputs0_size);
    sVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      (c->inputs_);
    if (sVar6 < sVar5) {
      iVar7 = ExpandedCompactionByteSizeLimit(this->options_);
      if (iVar3 + iVar4 < iVar7) {
        InternalKey::InternalKey((InternalKey *)&new_limit.field_0x18);
        InternalKey::InternalKey
                  ((InternalKey *)
                   &expanded1.
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        GetRange(this,(vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                      &inputs0_size,(InternalKey *)&new_limit.field_0x18,
                 (InternalKey *)
                 &expanded1.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
                  ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   local_148);
        Version::GetOverlappingInputs
                  (this->current_,level_00 + 1,(InternalKey *)&new_limit.field_0x18,
                   (InternalKey *)
                   &expanded1.
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   local_148);
        sVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)local_148);
        sVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          (c->inputs_ + 1);
        if (sVar5 == sVar6) {
          info_log = this->options_->info_log;
          sVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size(c->inputs_);
          sVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size(c->inputs_ + 1);
          sVar8 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       &inputs0_size);
          sVar9 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       local_148);
          Log(info_log,"Expanding@%d %d+%d (%ld+%ld bytes) to %d+%d (%ld+%ld bytes)\n",
              (ulong)level_00,sVar5 & 0xffffffff,sVar6 & 0xffffffff,iVar2,iVar3,(int)sVar8,
              (int)sVar9,iVar4,iVar3);
          InternalKey::operator=
                    ((InternalKey *)&largest.field_0x18,(InternalKey *)&new_limit.field_0x18);
          InternalKey::operator=
                    ((InternalKey *)local_70,
                     (InternalKey *)
                     &expanded1.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator=
                    (c->inputs_,
                     (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     &inputs0_size);
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator=
                    (c->inputs_ + 1,
                     (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     local_148);
          GetRange2(this,c->inputs_,c->inputs_ + 1,(InternalKey *)&all_limit.field_0x18,
                    (InternalKey *)
                    &expanded0.
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
                  ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   local_148);
        InternalKey::~InternalKey
                  ((InternalKey *)
                   &expanded1.
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        InternalKey::~InternalKey((InternalKey *)&new_limit.field_0x18);
      }
    }
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               &inputs0_size);
  }
  if ((int)(level_00 + 2) < 7) {
    Version::GetOverlappingInputs
              (this->current_,level_00 + 2,(InternalKey *)&all_limit.field_0x18,
               (InternalKey *)
               &expanded0.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&c->grandparents_);
  }
  InternalKey::Encode((InternalKey *)local_70);
  Slice::ToString_abi_cxx11_(local_168);
  std::__cxx11::string::operator=
            ((string *)(&this->field_0x170 + (long)(int)level_00 * 0x20),(string *)local_168);
  std::__cxx11::string::~string((string *)local_168);
  VersionEdit::SetCompactPointer(&c->edit_,level_00,(InternalKey *)local_70);
  InternalKey::~InternalKey
            ((InternalKey *)
             &expanded0.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  InternalKey::~InternalKey((InternalKey *)&all_limit.field_0x18);
  InternalKey::~InternalKey((InternalKey *)local_70);
  InternalKey::~InternalKey((InternalKey *)&largest.field_0x18);
  return;
}

Assistant:

void VersionSet::SetupOtherInputs(Compaction* c) {
  const int level = c->level();
  InternalKey smallest, largest;

  AddBoundaryInputs(icmp_, current_->files_[level], &c->inputs_[0]);
  GetRange(c->inputs_[0], &smallest, &largest);

  current_->GetOverlappingInputs(level + 1, &smallest, &largest,
                                 &c->inputs_[1]);

  // Get entire range covered by compaction
  InternalKey all_start, all_limit;
  GetRange2(c->inputs_[0], c->inputs_[1], &all_start, &all_limit);

  // See if we can grow the number of inputs in "level" without
  // changing the number of "level+1" files we pick up.
  if (!c->inputs_[1].empty()) {
    std::vector<FileMetaData*> expanded0;
    current_->GetOverlappingInputs(level, &all_start, &all_limit, &expanded0);
    AddBoundaryInputs(icmp_, current_->files_[level], &expanded0);
    const int64_t inputs0_size = TotalFileSize(c->inputs_[0]);
    const int64_t inputs1_size = TotalFileSize(c->inputs_[1]);
    const int64_t expanded0_size = TotalFileSize(expanded0);
    if (expanded0.size() > c->inputs_[0].size() &&
        inputs1_size + expanded0_size <
            ExpandedCompactionByteSizeLimit(options_)) {
      InternalKey new_start, new_limit;
      GetRange(expanded0, &new_start, &new_limit);
      std::vector<FileMetaData*> expanded1;
      current_->GetOverlappingInputs(level + 1, &new_start, &new_limit,
                                     &expanded1);
      if (expanded1.size() == c->inputs_[1].size()) {
        Log(options_->info_log,
            "Expanding@%d %d+%d (%ld+%ld bytes) to %d+%d (%ld+%ld bytes)\n",
            level, int(c->inputs_[0].size()), int(c->inputs_[1].size()),
            long(inputs0_size), long(inputs1_size), int(expanded0.size()),
            int(expanded1.size()), long(expanded0_size), long(inputs1_size));
        smallest = new_start;
        largest = new_limit;
        c->inputs_[0] = expanded0;
        c->inputs_[1] = expanded1;
        GetRange2(c->inputs_[0], c->inputs_[1], &all_start, &all_limit);
      }
    }
  }

  // Compute the set of grandparent files that overlap this compaction
  // (parent == level+1; grandparent == level+2)
  if (level + 2 < config::kNumLevels) {
    current_->GetOverlappingInputs(level + 2, &all_start, &all_limit,
                                   &c->grandparents_);
  }

  // Update the place where we will do the next compaction for this level.
  // We update this immediately instead of waiting for the VersionEdit
  // to be applied so that if the compaction fails, we will try a different
  // key range next time.
  compact_pointer_[level] = largest.Encode().ToString();
  c->edit_.SetCompactPointer(level, largest);
}